

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::eval_leftShift_ivec4(ShaderEvalContext *c)

{
  Vector<float,_4> local_60;
  Vector<float,_4> local_50;
  _anonymous_namespace_ local_40 [16];
  Vector<int,_4> local_30;
  
  tcu::Vector<float,_4>::cast<int>(&local_50);
  tcu::Vector<float,_4>::cast<int>(&local_60);
  sr::(anonymous_namespace)::leftShift<int,4>
            (local_40,(Vector<int,_4> *)&local_50,(Vector<int,_4> *)&local_60);
  tcu::Vector<int,_4>::cast<float>(&local_30);
  *(undefined8 *)(c->color).m_data = local_30.m_data._0_8_;
  *(undefined8 *)((c->color).m_data + 2) = local_30.m_data._8_8_;
  return;
}

Assistant:

void eval_leftShift_int		(ShaderEvalContext& c) { c.color.x()	= (float)leftShift((int)c.in[0].z(),				(int)c.in[1].x()); }